

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

bool __thiscall
wabt::WastParser::ParseTextListOpt
          (WastParser *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  char *pcVar1;
  uchar *__args;
  ulong uVar2;
  iterator iVar3;
  byte bVar4;
  TokenType TVar5;
  Result RVar6;
  char *pcVar7;
  char *pcVar8;
  Token *__args_00;
  uint uVar9;
  undefined8 uVar10;
  ulong uVar11;
  char *pcVar12;
  uint32_t lo;
  TextVector texts;
  uint32_t digit;
  undefined1 local_a9 [25];
  iterator iStack_90;
  basic_string_view<char,_std::char_traits<char>_> *local_88;
  undefined8 local_80;
  undefined8 local_78;
  Token local_70;
  
  local_a9._17_8_ = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  iStack_90._M_current = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  local_88 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  TVar5 = Peek(this,0);
  if (TVar5 == Text) {
    do {
      Consume(&local_70,this);
      if (5 < local_70.token_type_ - AlignEqNat) {
        __assert_fail("HasText()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/token.h"
                      ,99,"std::string_view wabt::Token::text() const");
      }
      local_a9._1_8_ = local_70.field_2.text_._M_len;
      local_a9._9_8_ = local_70.field_2.text_._M_str;
      if (iStack_90._M_current == local_88) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)(local_a9 + 0x11),iStack_90,
                   (basic_string_view<char,_std::char_traits<char>_> *)(local_a9 + 1));
      }
      else {
        (iStack_90._M_current)->_M_len = local_70.field_2.text_._M_len;
        (iStack_90._M_current)->_M_str = local_70.field_2.text_._M_str;
        iStack_90._M_current = iStack_90._M_current + 1;
      }
      TVar5 = Peek(this,0);
    } while (TVar5 == Text);
  }
  local_78 = iStack_90._M_current;
  if ((basic_string_view<char,_std::char_traits<char>_> *)local_a9._17_8_ != iStack_90._M_current) {
    uVar10 = local_a9._17_8_;
    do {
      uVar2 = ((basic_string_view<char,_std::char_traits<char>_> *)uVar10)->_M_len;
      if (2 < uVar2) {
        uVar11 = uVar2 - 1;
        if (uVar2 - 2 <= uVar2 - 1) {
          uVar11 = uVar2 - 2;
        }
        if (0 < (long)uVar11) {
          pcVar7 = ((basic_string_view<char,_std::char_traits<char>_> *)uVar10)->_M_str;
          pcVar12 = pcVar7 + uVar11;
          local_80 = uVar10;
          do {
            if (pcVar7[1] == '\\') {
              bVar4 = pcVar7[2];
              if (bVar4 < 0x6e) {
                if (bVar4 == 0x22) {
                  local_70.loc.filename._M_len._0_1_ = 0x22;
                }
                else if (bVar4 == 0x27) {
                  local_70.loc.filename._M_len._0_1_ = 0x27;
                }
                else {
                  if (bVar4 != 0x5c) goto switchD_00182986_caseD_6f;
                  local_70.loc.filename._M_len._0_1_ = 0x5c;
                }
              }
              else {
                switch(bVar4) {
                case 0x6e:
                  local_70.loc.filename._M_len._0_1_ = 10;
                  break;
                default:
switchD_00182986_caseD_6f:
                  RVar6 = ParseHexdigit(pcVar7[2],(uint32_t *)&local_70);
                  if ((RVar6.enum_ != Ok) ||
                     (RVar6 = ParseHexdigit(pcVar7[3],(uint32_t *)(local_a9 + 1)), RVar6.enum_ != Ok
                     )) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                                  ,0x83,
                                  "void wabt::(anonymous namespace)::RemoveEscapes(std::string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::vector<unsigned char>>]"
                                 );
                  }
                  pcVar8 = pcVar7 + 3;
                  local_a9[0] = (byte)((undefined4)local_70.loc.filename._M_len << 4) |
                                (byte)local_a9._1_8_;
                  __args_00 = (Token *)local_a9;
                  goto LAB_0018299f;
                case 0x72:
                  local_70.loc.filename._M_len._0_1_ = 0xd;
                  break;
                case 0x74:
                  local_70.loc.filename._M_len._0_1_ = 9;
                  break;
                case 0x75:
                  uVar9 = 0;
                  pcVar8 = pcVar7 + 4;
                  do {
                    RVar6 = ParseHexdigit(*pcVar8,(uint32_t *)&local_70);
                    if (RVar6.enum_ != Ok) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                                    ,0x5b,
                                    "void wabt::(anonymous namespace)::RemoveEscapes(std::string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::vector<unsigned char>>]"
                                   );
                    }
                    uVar9 = uVar9 << 4 | (undefined4)local_70.loc.filename._M_len;
                    pcVar7 = pcVar8 + 1;
                    pcVar1 = pcVar8 + 1;
                    pcVar8 = pcVar7;
                  } while (*pcVar1 != '}');
                  __args = local_a9 + 1;
                  if (0x10ffff < uVar9) {
                    __assert_fail("scalar_value < 0x110000",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                                  ,0x61,
                                  "void wabt::(anonymous namespace)::RemoveEscapes(std::string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::vector<unsigned char>>]"
                                 );
                  }
                  if (0x7f < uVar9) {
                    if (uVar9 < 0x800) {
                      bVar4 = (byte)(uVar9 >> 6) | 0xc0;
                    }
                    else {
                      if (uVar9 < 0x10000) {
                        bVar4 = (byte)(uVar9 >> 0xc) | 0xe0;
                      }
                      else {
                        local_a9._1_8_ = CONCAT71(local_a9._2_7_,(char)(uVar9 >> 0x12)) | 0xf0;
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                        emplace_back<unsigned_char>(out_data,__args);
                        bVar4 = (byte)(uVar9 >> 0xc) & 0x3f | 0x80;
                      }
                      local_a9[1] = bVar4;
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                      emplace_back<unsigned_char>(out_data,__args);
                      bVar4 = (byte)(uVar9 >> 6) & 0x3f | 0x80;
                    }
                    local_a9[1] = bVar4;
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                    emplace_back<unsigned_char>(out_data,__args);
                    uVar9 = (uint)((byte)uVar9 & 0x3f | 0x80);
                  }
                  local_a9[1] = (char)uVar9;
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                  emplace_back<unsigned_char>(out_data,__args);
                  uVar10 = local_80;
                  goto LAB_00182a5d;
                }
              }
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>(out_data,(uchar *)&local_70);
              pcVar7 = pcVar7 + 2;
            }
            else {
              pcVar8 = pcVar7 + 1;
              local_70.loc.filename._M_len._0_1_ = pcVar7[1];
              __args_00 = &local_70;
LAB_0018299f:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>(out_data,(uchar *)__args_00);
              pcVar7 = pcVar8;
            }
LAB_00182a5d:
          } while (pcVar7 < pcVar12);
        }
      }
      uVar10 = uVar10 + 0x10;
    } while (uVar10 != local_78);
  }
  iVar3._M_current = iStack_90._M_current;
  uVar10 = local_a9._17_8_;
  if ((basic_string_view<char,_std::char_traits<char>_> *)local_a9._17_8_ !=
      (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
    operator_delete((void *)local_a9._17_8_,(long)local_88 - local_a9._17_8_);
  }
  return (basic_string_view<char,_std::char_traits<char>_> *)uVar10 != iVar3._M_current;
}

Assistant:

bool WastParser::ParseTextListOpt(std::vector<uint8_t>* out_data) {
  WABT_TRACE(ParseTextListOpt);
  TextVector texts;
  while (PeekMatch(TokenType::Text))
    texts.push_back(Consume().text());

  RemoveEscapes(texts, std::back_inserter(*out_data));
  return !texts.empty();
}